

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::cleanup
          (SmallVectorBase<slang::Diagnostic> *this,EVP_PKEY_CTX *ctx)

{
  std::_Destroy_aux<false>::__destroy<slang::Diagnostic*>(this->data_,this->data_ + this->len);
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::destroy(begin(), end());
        if (!isSmall())
            free(data_);
    }